

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedback::DrawXFB::checkFramebuffer
          (DrawXFB *this,GLfloat r,GLfloat g,GLfloat b,GLfloat a)

{
  long lVar1;
  char cVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  char *pcVar4;
  value_type_conflict5 *__val;
  ulong uVar5;
  bool bVar6;
  
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  pcVar4 = (char *)operator_new(0x10);
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  pcVar4[8] = '\0';
  pcVar4[9] = '\0';
  pcVar4[10] = '\0';
  pcVar4[0xb] = '\0';
  pcVar4[0xc] = '\0';
  pcVar4[0xd] = '\0';
  pcVar4[0xe] = '\0';
  pcVar4[0xf] = '\0';
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))(0,0,2,2,0x1908,0x1401,pcVar4);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1235);
  cVar2 = (char)(int)(r * 255.0);
  if (*pcVar4 == cVar2) {
    bVar6 = false;
    uVar5 = 0;
    while (((pcVar4[uVar5 * 4 + 1] == (char)(int)(g * 255.0) &&
            (pcVar4[uVar5 * 4 + 2] == (char)(int)(b * 255.0))) &&
           (pcVar4[uVar5 * 4 + 3] == (char)(int)(a * 255.0)))) {
      bVar6 = 2 < uVar5;
      if ((uVar5 == 3) || (lVar1 = uVar5 * 4, uVar5 = uVar5 + 1, pcVar4[lVar1 + 4] != cVar2)) break;
    }
  }
  else {
    bVar6 = false;
  }
  operator_delete(pcVar4,0x10);
  return bVar6;
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFB::checkFramebuffer(glw::GLfloat r, glw::GLfloat g, glw::GLfloat b,
														  glw::GLfloat a)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Number of pixels. */
	const glw::GLuint number_of_pixels = s_view_size * s_view_size;

	/* Fetch framebuffer. */
	std::vector<glw::GLubyte> pixels(number_of_pixels * 4 /* components */);

	if ((s_view_size > 0) && (s_view_size > 0))
	{
		gl.readPixels(0, 0, s_view_size, s_view_size, GL_RGBA, GL_UNSIGNED_BYTE, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Convert color to integer. */
	glw::GLubyte ir = (glw::GLubyte)(255.f * r);
	glw::GLubyte ig = (glw::GLubyte)(255.f * g);
	glw::GLubyte ib = (glw::GLubyte)(255.f * b);
	glw::GLubyte ia = (glw::GLubyte)(255.f * a);

	/* Check results. */
	for (glw::GLuint i = 0; i < number_of_pixels; ++i)
	{
		if ((pixels[i * 4 /* components */] != ir) || (pixels[i * 4 /* components */ + 1] != ig) ||
			(pixels[i * 4 /* components */ + 2] != ib) || (pixels[i * 4 /* components */ + 3] != ia))
		{
			return false;
		}
	}

	return true;
}